

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O2

void tc_ap_str_match(CuTest *tc)

{
  int iVar1;
  
  iVar1 = ap_str_match((char *)0x0,(char *)0x0,";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xc5,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match((char *)0x0,"0123456789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xc6,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789",(char *)0x0,";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,199,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("","0123456789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,200,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xc9,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0123",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xca,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123","0123456789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xcb,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xce,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","??",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xcf,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","01?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd0,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","01?3",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd1,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match(";","?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd2,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match(";{}","??",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd3,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("|","?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd4,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("01&","01?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd5,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("012)45","012?45",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd6,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","*a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xd9,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","a*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xda,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0a*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xdb,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0*a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xdc,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0*a*9",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xdd,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","*9a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xde,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0*9a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xdf,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","0*a9",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe0,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","***a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe1,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","a***",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe2,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0123456789","012345678*a",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe3,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("|","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe4,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe5,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe6,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|","0*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe7,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2","0*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe8,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xe9,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2","0*2",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xea,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|23","0*2*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xeb,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2|","0*2*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xec,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2|4","0*2*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xed,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("0|2|45","0*2*5",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xee,"should return error",(uint)(iVar1 != 0));
  iVar1 = ap_str_match("","",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xf2,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","0123456789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xf3,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0","?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xf6,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("01","0?",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xf7,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","??????????",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xf8,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xfb,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xfc,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("01","01*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xfd,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("01","0*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xfe,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("01","*1",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0xff,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x100,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","0*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x101,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","0*9",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x102,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","*6789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x103,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","01234*6789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x104,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","0*4*9",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x105,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","*4*6*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x106,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","0*2345678*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x107,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","01234*678*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x108,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","01234*67*9",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x109,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","01234****6789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x10a,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","01234***56789",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x10b,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("0123456789","012*34***56789*",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x10c,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("/usr/bin/sudo /sbin/zfs send -I \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_08:00:02_hourly\' \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_09:00:02_hourly\' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,
                       "/usr/bin/sudo /sbin/zfs send -I \'*\' \'*\' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x110,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("/usr/bin/sudo /sbin/zfs send -I \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_08:00:02_hourly\' \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_09:00:02_hourly\' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,
                       "/usr/bin/sudo /sbin/zfs send * | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x114,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("/usr/bin/sudo /sbin/zfs send -I \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_08:00:02_hourly\' \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_09:00:02_hourly\' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,"/usr/bin/sudo /sbin/zfs send * | /usr/bin/mbuffer *",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x118,"should match",(uint)(iVar1 == 0));
  iVar1 = ap_str_match("/usr/bin/sudo /sbin/zfs send -I \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_08:00:02_hourly\' \'rpool/ROOT/ubuntu\'@\'autosnap_2018-11-23_09:00:02_hourly\' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null"
                       ,"/usr/bin/sudo /sbin/zfs send * | *",";{}|`()&");
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_all_cmakelists_25/11001100[P]authprogs/test/unit/test_str.c"
                ,0x11c,"should match",(uint)(iVar1 == 0));
  return;
}

Assistant:

static void tc_ap_str_match (CuTest* tc)
{
	const char	*invalid_chars	= ";{}|`()&";

	// should return error
	// simple
	CuAssert (tc, "should return error", ap_str_match(NULL, NULL, invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match(NULL, "0123456789", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", NULL, invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("", "0123456789", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0123", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123", "0123456789", invalid_chars) != 0);
	
	// ?
	CuAssert (tc, "should return error", ap_str_match("0123456789", "?", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "??", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "01?", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "01?3", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match(";", "?", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match(";{}", "??", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("|", "?", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("01&", "01?", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("012)45", "012?45", invalid_chars) != 0);

	// *
	CuAssert (tc, "should return error", ap_str_match("0123456789", "*a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "a*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0a*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0*a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0*a*9", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "*9a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0*9a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "0*a9", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "***a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "a***", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0123456789", "012345678*a", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("|", "*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|", "*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2", "*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|", "0*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2", "0*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2", "*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2", "0*2", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|23", "0*2*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2|", "0*2*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2|4", "0*2*", invalid_chars) != 0);
	CuAssert (tc, "should return error", ap_str_match("0|2|45", "0*2*5", invalid_chars) != 0);
		
	// should match
	// simple
	CuAssert (tc, "should match", ap_str_match("", "", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "0123456789", invalid_chars) == 0);

	// ?
	CuAssert (tc, "should match", ap_str_match("0", "?", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("01", "0?", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "??????????", invalid_chars) == 0);

	// *
	CuAssert (tc, "should match", ap_str_match("", "*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0", "*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("01", "01*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("01", "0*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("01", "*1", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "0*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "0*9", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "*6789", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "01234*6789", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "0*4*9", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "*4*6*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "0*2345678*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "01234*678*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "01234*67*9", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "01234****6789", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "01234***56789", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match("0123456789", "012*34***56789*", invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match(
		"/usr/bin/sudo /sbin/zfs send -I 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_08:00:02_hourly' 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_09:00:02_hourly' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		"/usr/bin/sudo /sbin/zfs send -I '*' '*' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match(
		"/usr/bin/sudo /sbin/zfs send -I 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_08:00:02_hourly' 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_09:00:02_hourly' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		"/usr/bin/sudo /sbin/zfs send * | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match(
		"/usr/bin/sudo /sbin/zfs send -I 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_08:00:02_hourly' 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_09:00:02_hourly' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		"/usr/bin/sudo /sbin/zfs send * | /usr/bin/mbuffer *"
		, invalid_chars) == 0);
	CuAssert (tc, "should match", ap_str_match(
		"/usr/bin/sudo /sbin/zfs send -I 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_08:00:02_hourly' 'rpool/ROOT/ubuntu'@'autosnap_2018-11-23_09:00:02_hourly' | /usr/bin/mbuffer  -q -s 128k -m 16M 2>/dev/null",
		"/usr/bin/sudo /sbin/zfs send * | *",
		invalid_chars) == 0);
}